

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::list
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *client;
  Url UStack_38;
  
  client = this->client_;
  if (this->version_ == v1) {
    getUrl(&UStack_38,this,path);
    HttpConsumer::list(__return_storage_ptr__,client,&UStack_38);
  }
  else {
    getMetadataUrl(&UStack_38,this,path);
    HttpConsumer::list(__return_storage_ptr__,client,&UStack_38);
  }
  std::__cxx11::string::~string((string *)&UStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::KeyValue::list(const Vault::Path &path) {
  return version_ == KeyValue::Version::v1
             ? Vault::HttpConsumer::list(client_, getUrl(path))
             : Vault::HttpConsumer::list(client_, getMetadataUrl(path));
}